

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_functions.hpp
# Opt level: O3

void so_5::impl::instantiator_and_sender_base<so_5::stats::messages::distribution_started,_false>::
     send<>(mbox_t *to)

{
  atomic_refcounted_t *paVar1;
  abstract_message_box_t *paVar2;
  pointer *__ptr;
  distribution_started *local_28;
  distribution_started *local_20;
  pointer_____offset_0x10___ *local_18;
  
  paVar2 = to->m_obj;
  details::make_message_instance_impl<false,_so_5::stats::messages::distribution_started>::make<>();
  local_18 = &stats::messages::distribution_started::typeinfo;
  ensure_message_with_actual_data<so_5::stats::messages::distribution_started>(local_28);
  (*(local_28->super_message_t)._vptr_message_t[4])(local_28,0);
  local_20 = local_28;
  if (local_28 != (distribution_started *)0x0) {
    LOCK();
    paVar1 = &(local_28->super_message_t).super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  (*paVar2->_vptr_abstract_message_box_t[7])(paVar2,&local_18,&local_20,1);
  if (local_20 != (distribution_started *)0x0) {
    LOCK();
    paVar1 = &(local_20->super_message_t).super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (local_20 != (distribution_started *)0x0)) {
      (*(local_20->super_message_t)._vptr_message_t[1])();
    }
  }
  return;
}

Assistant:

void
send( TARGET && to, ARGS&&... args )
	{
		so_5::impl::instantiator_and_sender< MESSAGE >::send(
				send_functions_details::arg_to_mbox( std::forward<TARGET>(to) ),
				std::forward<ARGS>(args)... );
	}